

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::detail::filldata<const_char32_t[1]>::fill(ostream *stream,char32_t (*in) [1])

{
  String SStack_28;
  
  std::operator<<(stream,"[");
  String::String(&SStack_28,"{?}");
  doctest::operator<<(stream,&SStack_28);
  String::~String(&SStack_28);
  std::operator<<(stream,"]");
  return;
}

Assistant:

static void fill(std::ostream* stream, const T(&in)[N]) {
            *stream << "[";
            for (size_t i = 0; i < N; i++) {
                if (i != 0) { *stream << ", "; }
                *stream << (DOCTEST_STRINGIFY(in[i]));
            }
            *stream << "]";
        }